

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

qsizetype QtPrivate::count(QStringView haystack,QStringView needle,CaseSensitivity cs)

{
  long lVar1;
  QStringView str;
  QStringView str_00;
  qsizetype qVar2;
  storage_type_conflict *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype num;
  QStringMatcher matcher;
  qsizetype from;
  QStringMatcher *this;
  undefined8 in_stack_fffffffffffffe60;
  CaseSensitivity cs_00;
  QStringMatcher *in_stack_fffffffffffffe68;
  qsizetype in_stack_fffffffffffffe70;
  storage_type_conflict *in_stack_fffffffffffffe78;
  QStringView local_160;
  QStringView local_150;
  undefined1 local_140 [92];
  CaseSensitivity in_stack_ffffffffffffff1c;
  qsizetype in_stack_ffffffffffffff20;
  QStringView in_stack_ffffffffffffff90;
  QStringView in_stack_ffffffffffffffa0;
  
  cs_00 = (CaseSensitivity)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QStringMatcher *)0x0;
  from = -1;
  local_150.m_size = (qsizetype)in_RDI;
  qVar2 = QStringView::size(&local_150);
  if ((qVar2 < 0x1f5) || (qVar2 = QStringView::size(&local_160), qVar2 < 6)) {
    while (qVar2 = findString(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff20,
                              in_stack_ffffffffffffff90,in_stack_ffffffffffffff1c), qVar2 != -1) {
      this = (QStringMatcher *)((long)&this->d_ptr + 1);
    }
  }
  else {
    memset(local_140,0xaa,0x138);
    str.m_data = in_stack_fffffffffffffe78;
    str.m_size = in_stack_fffffffffffffe70;
    QStringMatcher::QStringMatcher(in_stack_fffffffffffffe68,str,cs_00);
    while (str_00.m_data = (storage_type_conflict *)local_150.m_size,
          str_00.m_size = in_stack_fffffffffffffe70,
          from = QStringMatcher::indexIn(this,str_00,from), from != -1) {
      this = (QStringMatcher *)((long)&this->d_ptr + 1);
    }
    QStringMatcher::~QStringMatcher((QStringMatcher *)0x50f32f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (qsizetype)this;
}

Assistant:

qsizetype QtPrivate::count(QStringView haystack, QStringView needle, Qt::CaseSensitivity cs) noexcept
{
    qsizetype num = 0;
    qsizetype i = -1;
    if (haystack.size() > 500 && needle.size() > 5) {
        QStringMatcher matcher(needle, cs);
        while ((i = matcher.indexIn(haystack, i + 1)) != -1)
            ++num;
    } else {
        while ((i = QtPrivate::findString(haystack, i + 1, needle, cs)) != -1)
            ++num;
    }
    return num;
}